

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

char * spvOpcodeString(uint32_t opcode)

{
  undefined1 *puVar1;
  ulong uVar2;
  difference_type __d;
  ulong uVar3;
  
  puVar1 = (anonymous_namespace)::kOpcodeTableEntries;
  uVar3 = 0x2f7;
  while (uVar2 = uVar3, 0 < (long)uVar2) {
    uVar3 = uVar2 >> 1;
    if (*(uint *)((long)puVar1 + (uVar3 * 0x11 + 1) * 8) < opcode) {
      puVar1 = (undefined1 *)((long)puVar1 + (uVar3 * 0x11 + 0x11) * 8);
      uVar3 = ~uVar3 + uVar2;
    }
  }
  if ((puVar1 != &DAT_0045d908) && (*(uint32_t *)((long)puVar1 + 8) == opcode)) {
    return *(char **)puVar1;
  }
  __assert_fail("0 && \"Unreachable!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/opcode.cpp"
                ,0xe1,"const char *spvOpcodeString(const uint32_t)");
}

Assistant:

const char* spvOpcodeString(const uint32_t opcode) {
  const auto beg = kOpcodeTableEntries;
  const auto end = kOpcodeTableEntries + ARRAY_SIZE(kOpcodeTableEntries);
  spv_opcode_desc_t needle = {"",    static_cast<spv::Op>(opcode),
                              0,     nullptr,
                              0,     {},
                              0,     {},
                              false, false,
                              0,     nullptr,
                              ~0u,   ~0u};
  auto comp = [](const spv_opcode_desc_t& lhs, const spv_opcode_desc_t& rhs) {
    return lhs.opcode < rhs.opcode;
  };
  auto it = std::lower_bound(beg, end, needle, comp);
  if (it != end && it->opcode == spv::Op(opcode)) {
    return it->name;
  }

  assert(0 && "Unreachable!");
  return "unknown";
}